

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderInvarianceRule5Test::initTestIterations
          (TessellationShaderInvarianceRule5Test *this)

{
  GLfloat primitive_mode_00;
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  size_type sVar3;
  undefined1 local_b4 [8];
  _test_iteration test;
  _tessellation_levels *levels;
  _tessellation_levels_set local_78;
  undefined1 local_60 [8];
  _tessellation_levels_set levels_set;
  uint local_40;
  _tessellation_shader_vertex_ordering vertex_ordering;
  uint n_vo_mode;
  _tessellation_primitive_mode primitive_mode;
  uint n_primitive_mode;
  uint n_vo_modes;
  uint n_primitive_modes;
  _tessellation_shader_vertex_ordering vo_modes [2];
  _tessellation_primitive_mode primitive_modes [2];
  GLint gl_max_tess_gen_level_value;
  Functions *gl;
  TessellationShaderInvarianceRule5Test *this_local;
  
  pRVar2 = deqp::Context::getRenderContext
                     ((this->super_TessellationShaderInvarianceBaseTest).super_TestCaseBase.
                      m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  register0x00000000 = CONCAT44(extraout_var,iVar1);
  primitive_modes[0] = TESSELLATION_SHADER_PRIMITIVE_MODE_FIRST;
  (**(code **)(register0x00000000 + 0x868))
            ((this->super_TessellationShaderInvarianceBaseTest).super_TestCaseBase.m_glExtTokens.
             MAX_TESS_GEN_LEVEL,primitive_modes);
  err = (**(code **)(stack0xffffffffffffffe8 + 0x800))();
  glu::checkError(err,"glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                  ,0x7fe);
  vo_modes[0] = TESSELLATION_SHADER_VERTEX_ORDERING_DEFAULT;
  vo_modes[1] = TESSELLATION_SHADER_VERTEX_ORDERING_CW;
  _n_vo_modes = 0x100000000;
  for (n_vo_mode = 0; n_vo_mode < 2; n_vo_mode = n_vo_mode + 1) {
    primitive_mode_00 = (GLfloat)vo_modes[n_vo_mode];
    for (local_40 = 0; local_40 < 2; local_40 = local_40 + 1) {
      levels_set.
      super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (GLfloat)(&n_vo_modes)[local_40];
      std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::vector
                ((vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                  *)local_60);
      TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode
                (&local_78,(_tessellation_primitive_mode)primitive_mode_00,primitive_modes[0],
                 TESSELLATION_LEVEL_SET_FILTER_ALL_LEVELS_USE_THE_SAME_VALUE);
      std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::
      operator=((vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_> *
                )local_60,&local_78);
      std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::
      ~vector(&local_78);
      sVar3 = std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
              ::size((vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                      *)local_60);
      test._28_8_ = std::
                    vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                    ::operator[]((vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                                  *)local_60,sVar3 - 1);
      _test_iteration::_test_iteration((_test_iteration *)local_b4);
      local_b4 = *(undefined1 (*) [8])test._28_8_;
      test.inner_tess_levels = *(GLfloat (*) [2])(test._28_8_ + 8);
      test.outer_tess_levels._0_8_ = *(undefined8 *)(test._28_8_ + 0x10);
      test.outer_tess_levels[3] =
           levels_set.
           super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      test.outer_tess_levels[2] = primitive_mode_00;
      if (primitive_mode_00 == 1.4013e-45) {
        std::
        vector<glcts::TessellationShaderInvarianceRule5Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule5Test::_test_iteration>_>
        ::push_back(&this->m_test_triangles_iterations,(value_type *)local_b4);
      }
      else {
        std::
        vector<glcts::TessellationShaderInvarianceRule5Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule5Test::_test_iteration>_>
        ::push_back(&this->m_test_quads_iterations,(value_type *)local_b4);
      }
      std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::
      ~vector((vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_> *)
              local_60);
    }
  }
  return;
}

Assistant:

void TessellationShaderInvarianceRule5Test::initTestIterations()
{
	DE_ASSERT(m_test_quads_iterations.size() == 0 && m_test_triangles_iterations.size() == 0);

	/* Retrieve GL_MAX_TESS_GEN_LEVEL_EXT value */
	const glw::Functions& gl						  = m_context.getRenderContext().getFunctions();
	glw::GLint			  gl_max_tess_gen_level_value = 0;

	gl.getIntegerv(m_glExtTokens.MAX_TESS_GEN_LEVEL, &gl_max_tess_gen_level_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname");

	/* Iterate through all primitive and vertex spacing modes relevant to the test */
	_tessellation_primitive_mode primitive_modes[] = { TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS,
													   TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES };
	_tessellation_shader_vertex_ordering vo_modes[] = {
		TESSELLATION_SHADER_VERTEX_ORDERING_CCW, TESSELLATION_SHADER_VERTEX_ORDERING_CW,
	};

	const unsigned int n_primitive_modes = sizeof(primitive_modes) / sizeof(primitive_modes[0]);
	const unsigned int n_vo_modes		 = sizeof(vo_modes) / sizeof(vo_modes[0]);

	for (unsigned int n_primitive_mode = 0; n_primitive_mode < n_primitive_modes; ++n_primitive_mode)
	{
		_tessellation_primitive_mode primitive_mode = primitive_modes[n_primitive_mode];

		for (unsigned int n_vo_mode = 0; n_vo_mode < n_vo_modes; ++n_vo_mode)
		{
			_tessellation_shader_vertex_ordering vertex_ordering = vo_modes[n_vo_mode];

			/* Retrieve inner/outer tessellation level combinations we want the tests to be run for */
			_tessellation_levels_set levels_set;

			levels_set = TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode(
				primitive_mode, gl_max_tess_gen_level_value,
				TESSELLATION_LEVEL_SET_FILTER_ALL_LEVELS_USE_THE_SAME_VALUE);

			/* Only use the last inner/outer level configuration, as reported by the utils function. */
			const _tessellation_levels& levels = levels_set[levels_set.size() - 1];

			/* Create a test descriptor for all the parameters we now have */
			_test_iteration test;

			memcpy(test.inner_tess_levels, levels.inner, sizeof(test.inner_tess_levels));
			memcpy(test.outer_tess_levels, levels.outer, sizeof(test.outer_tess_levels));

			test.primitive_mode  = primitive_mode;
			test.vertex_ordering = vertex_ordering;

			if (primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES)
			{
				m_test_triangles_iterations.push_back(test);
			}
			else
			{
				m_test_quads_iterations.push_back(test);
			}
		} /* for (all vertex spacing modes) */
	}	 /* for (all primitive modes) */
}